

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void writeRgba1(char *fileName,Rgba *pixels,int width,int height)

{
  undefined4 uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  ulong in_RSI;
  undefined8 in_RDI;
  RgbaOutputFile file;
  Vec2<float> local_38;
  Rgba local_30 [4];
  ulong local_10;
  
  local_10 = in_RSI;
  Imath_3_2::Vec2<float>::Vec2(&local_38,0.0,0.0);
  uVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,local_30,in_RDI,in_EDX,in_ECX,0xf,&local_38,0,4,uVar1);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_30,local_10,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)local_30);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_30);
  return;
}

Assistant:

void
writeRgba1 (const char fileName[], const Rgba* pixels, int width, int height)
{
    //
    // Write an RGBA image using class RgbaOutputFile.
    //
    //	- open the file
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    RgbaOutputFile file (fileName, width, height, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}